

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O1

void __thiscall bitfoot::Bitfoot::AddRookMoves<false>(Bitfoot *this,uint64_t dests)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int to;
  ulong uVar7;
  int from;
  
  if (dests != 0) {
    for (uVar4 = this->pc[8]; uVar4 != 0; uVar4 = uVar4 & uVar4 - 1) {
      lVar1 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      uVar7 = ~this->pc[0] & this->slider[lVar1] & dests;
      if (uVar7 != 0) {
        from = (int)lVar1;
        do {
          lVar2 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
            }
          }
          to = (int)lVar2;
          if (from == to) {
            __assert_fail("from != to",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                          ,0x2df,
                          "bool bitfoot::Bitfoot::Pinned(const int, const int) const [color = false]"
                         );
          }
          if ((*(ulong *)(_BITMAP + lVar1 * 8) & this->pinned[0]) == 0) {
LAB_00117a86:
            iVar3 = (&_board)[lVar2];
            if ((long)iVar3 < 8) {
              iVar6 = StaticExchange<false,true>(this,from,to);
              iVar3 = (&_board)[lVar2];
            }
            else {
              if (0xb < iVar3 - 2U) {
                __assert_fail("!piece || IS_PIECE(piece)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                              ,0xff,"static int bitfoot::Bitfoot::ValueOf(const int)");
              }
              iVar6 = *(int *)(_VALUE_OF + (long)iVar3 * 4) + -0x1e;
            }
            AddMove<false,(bitfoot::MoveType)1>(this,8,from,to,iVar6,iVar3,0);
          }
          else if ((*(ulong *)(_BITMAP + lVar2 * 8) & this->pinned[0]) != 0) {
            iVar3 = 0;
            if ((ulong)(uint)this->king[0] < 0x40) {
              iVar3 = *(int *)((ulong)(uint)(from << 8) + 0x1b2660 + (ulong)(uint)this->king[0] * 4)
              ;
            }
            iVar6 = -iVar3;
            if (0 < iVar3) {
              iVar6 = iVar3;
            }
            iVar3 = *(int *)((ulong)(uint)(from << 8) + 0x1b2660 + lVar2 * 4);
            iVar5 = -iVar3;
            if (0 < iVar3) {
              iVar5 = iVar3;
            }
            if (iVar6 == iVar5) goto LAB_00117a86;
          }
          uVar7 = uVar7 & uVar7 - 1;
        } while (uVar7 != 0);
      }
    }
  }
  return;
}

Assistant:

inline void AddRookMoves(const uint64_t dests) {
    if (!dests || !pc[color|Rook]) {
      return;
    }

    uint64_t pieces = pc[color|Rook];
    uint64_t dest;
    int from;
    int to;

    while (pieces) {
      dest = (slider[PopLowSquare(pieces, from)] & dests & ~pc[color]);
      while (dest) {
        if (!Pinned<color>(from, PopLowSquare(dest, to))) {
          if (_board[to] >= Rook) {
            AddMove<color, Normal>((color|Rook), from, to,
                                   (ValueOf(_board[to]) - 30), _board[to], 0);
          }
          else {
            AddMove<color, Normal>((color|Rook), from, to,
                                   StaticExchange<color, true>(from, to),
                                   _board[to], 0);
          }
        }
      }
    }
  }